

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O0

bool __thiscall
nlohmann::detail::
json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
::parse_error(json_sax_dom_parser<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
              *this,size_t param_2,string *param_3,exception *ex)

{
  int iVar1;
  undefined8 uVar2;
  other_error *this_00;
  long in_RCX;
  long in_RDI;
  parse_error *in_stack_ffffffffffffffa8;
  parse_error *in_stack_ffffffffffffffb0;
  
  *(undefined1 *)(in_RDI + 0x28) = 1;
  if ((*(byte *)(in_RDI + 0x29) & 1) != 0) {
    iVar1 = *(int *)(in_RCX + 8) / 100;
    switch(~((iVar1 / 100) * 100) + iVar1) {
    case 0:
      uVar2 = __cxa_allocate_exception(0x28);
      detail::parse_error::parse_error(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      __cxa_throw(uVar2,&detail::parse_error::typeinfo,detail::parse_error::~parse_error);
    case 1:
      uVar2 = __cxa_allocate_exception(0x20);
      invalid_iterator::invalid_iterator
                ((invalid_iterator *)in_stack_ffffffffffffffb0,
                 (invalid_iterator *)in_stack_ffffffffffffffa8);
      __cxa_throw(uVar2,&invalid_iterator::typeinfo,invalid_iterator::~invalid_iterator);
    case 2:
      uVar2 = __cxa_allocate_exception(0x20);
      type_error::type_error
                ((type_error *)in_stack_ffffffffffffffb0,(type_error *)in_stack_ffffffffffffffa8);
      __cxa_throw(uVar2,&type_error::typeinfo,type_error::~type_error);
    case 3:
      uVar2 = __cxa_allocate_exception(0x20);
      out_of_range::out_of_range
                ((out_of_range *)in_stack_ffffffffffffffb0,(out_of_range *)in_stack_ffffffffffffffa8
                );
      __cxa_throw(uVar2,&out_of_range::typeinfo,out_of_range::~out_of_range);
    case 4:
      this_00 = (other_error *)__cxa_allocate_exception(0x20);
      other_error::other_error(this_00,(other_error *)in_stack_ffffffffffffffa8);
      __cxa_throw(this_00,&other_error::typeinfo,other_error::~other_error);
    }
  }
  return false;
}

Assistant:

bool parse_error(std::size_t, const std::string&,
                     const detail::exception& ex)
    {
        errored = true;
        if (allow_exceptions)
        {
            // determine the proper exception type from the id
            switch ((ex.id / 100) % 100)
            {
                case 1:
                    JSON_THROW(*reinterpret_cast<const detail::parse_error*>(&ex));
                case 4:
                    JSON_THROW(*reinterpret_cast<const detail::out_of_range*>(&ex));
                // LCOV_EXCL_START
                case 2:
                    JSON_THROW(*reinterpret_cast<const detail::invalid_iterator*>(&ex));
                case 3:
                    JSON_THROW(*reinterpret_cast<const detail::type_error*>(&ex));
                case 5:
                    JSON_THROW(*reinterpret_cast<const detail::other_error*>(&ex));
                default:
                    assert(false);
                    // LCOV_EXCL_STOP
            }
        }
        return false;
    }